

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall Lexer::Lexer(Lexer *this,string *userFileName)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12c;
  undefined1 local_12b;
  allocator local_12a;
  allocator local_129;
  allocator local_128;
  allocator local_127;
  allocator local_126;
  allocator local_125 [20];
  allocator local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  string *userFileName_local;
  Lexer *this_local;
  
  local_18 = (undefined1  [8])userFileName;
  userFileName_local = &this->flight_text_file;
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->text_commands_lexed);
  local_12b = 1;
  local_110 = &local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"<-",&local_111);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"->",local_125);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"<=",&local_126);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,">=",&local_127);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"<",&local_128);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,">",&local_129);
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"=",&local_12a);
  local_12b = 0;
  local_28 = &local_108;
  local_20 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_12c);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->operators_to_check,__l,&local_12c);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_12c);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  do {
    local_1d8 = local_1d8 + -1;
    std::__cxx11::string::~string((string *)local_1d8);
  } while (local_1d8 != &local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::~allocator((allocator<char> *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_127);
  std::allocator<char>::~allocator((allocator<char> *)&local_126);
  std::allocator<char>::~allocator((allocator<char> *)local_125);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::operator=((string *)this,(string *)userFileName);
  return;
}

Assistant:

Lexer::Lexer(string userFileName) {
  this->flight_text_file = userFileName;
}